

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_notif(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_notif **notifs)

{
  lysp_ext_instance **exts;
  lysp_node_notif *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_node_notif *parent_00;
  lysp_node_notif *plVar4;
  char *pcVar5;
  char **ppcVar6;
  char *format;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_restr **restrs;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  ly_ctx *plVar7;
  lysp_ext_instance **exts_00;
  ly_stmt lVar8;
  bool bVar9;
  undefined4 uStack_90;
  ly_stmt kw;
  lysp_node **local_88;
  char *word;
  size_t word_len;
  lysp_restr **local_70;
  char **local_68;
  lysp_qname **local_60;
  char **local_58;
  uint16_t *local_50;
  lysp_tpdf **local_48;
  lysp_node_grp **local_40;
  char *buf;
  
  parent_00 = (lysp_node_notif *)calloc(1,0x60);
  if (parent_00 == (lysp_node_notif *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = LY_EMEM;
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_notif");
  }
  else {
    plVar1 = *notifs;
    if (*notifs != (lysp_node_notif *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = (lysp_node_notif *)(plVar4->field_0).node.next;
      } while (plVar1 != (lysp_node_notif *)0x0);
      notifs = &(plVar4->field_0).field_1.next;
    }
    *notifs = parent_00;
    exts_00 = (lysp_ext_instance **)&buf;
    LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts_00,&word_len);
    if (LVar3 == LY_SUCCESS) {
      if (buf == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = word;
        if (word_len == 0) {
          pcVar5 = "";
        }
        LVar3 = lydict_insert(plVar7,pcVar5,word_len,&(parent_00->field_0).node.name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar3 = lydict_insert_zc(plVar7,word,&(parent_00->field_0).node.name);
      }
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x400;
        (parent_00->field_0).node.parent = parent;
        LVar3 = get_keyword(ctx,&kw,&word,&word_len);
        if (LVar3 == LY_SUCCESS) {
          if (kw == LY_STMT_SYNTAX_SEMICOLON) {
            bVar9 = false;
            restrs = extraout_RDX;
          }
          else {
            if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar7 = (ly_ctx *)0x0;
              }
              else {
                plVar7 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar5 = lyplg_ext_stmt2str(kw);
              ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
              return LY_EVALID;
            }
            LVar3 = get_keyword(ctx,&kw,&word,&word_len);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
            restrs = extraout_RDX_00;
          }
          exts = &(parent_00->field_0).node.exts;
          local_40 = &parent_00->groupings;
          local_48 = &parent_00->typedefs;
          local_70 = &parent_00->musts;
          local_88 = &parent_00->child;
          local_50 = &(parent_00->field_0).node.flags;
          local_58 = &(parent_00->field_0).node.ref;
          local_60 = &(parent_00->field_0).node.iffeatures;
          local_68 = &(parent_00->field_0).node.dsc;
          lVar8 = kw;
          do {
            if (!bVar9) {
              return LY_SUCCESS;
            }
            if (lVar8 == LY_STMT_ANYDATA) {
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                pcVar5 = "anydata";
LAB_001719ea:
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
LAB_00171a1b:
                ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"notification");
                return LY_EVALID;
              }
LAB_001718d2:
              LVar3 = parse_any(ctx,lVar8,(lysp_node *)parent_00,local_88);
            }
            else {
              if (lVar8 == LY_STMT_ANYXML) goto LAB_001718d2;
              if (lVar8 == LY_STMT_CHOICE) {
                LVar3 = parse_choice(ctx,(lysp_node *)parent_00,local_88);
              }
              else if (lVar8 == LY_STMT_CONTAINER) {
                LVar3 = parse_container(ctx,(lysp_node *)parent_00,local_88);
              }
              else if (lVar8 == LY_STMT_GROUPING) {
                LVar3 = parse_grouping(ctx,(lysp_node *)parent_00,local_40);
              }
              else if (lVar8 == LY_STMT_LEAF) {
                LVar3 = parse_leaf(ctx,(lysp_node *)parent_00,local_88);
              }
              else if (lVar8 == LY_STMT_LEAF_LIST) {
                LVar3 = parse_leaflist(ctx,(lysp_node *)parent_00,local_88);
              }
              else if (lVar8 == LY_STMT_LIST) {
                LVar3 = parse_list(ctx,(lysp_node *)parent_00,local_88);
              }
              else if (lVar8 == LY_STMT_USES) {
                LVar3 = parse_uses(ctx,(lysp_node *)parent_00,local_88);
              }
              else if (lVar8 == LY_STMT_TYPEDEF) {
                LVar3 = parse_typedef(ctx,(lysp_node *)parent_00,local_48);
              }
              else if (lVar8 == LY_STMT_EXTENSION_INSTANCE) {
                exts_00 = (lysp_ext_instance **)0x1;
                LVar3 = parse_ext(ctx,word,word_len,parent_00,LY_STMT_NOTIFICATION,0,exts);
              }
              else if (lVar8 == LY_STMT_IF_FEATURE) {
                LVar3 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_60,(yang_arg)exts,exts_00);
              }
              else if (lVar8 == LY_STMT_MUST) {
                plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                if (*(byte *)&plVar2[2].schema < 2) {
                  plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                  pcVar5 = "must";
                  goto LAB_001719ea;
                }
                LVar3 = parse_restrs(ctx,(ly_stmt)local_70,restrs);
              }
              else {
                if (lVar8 == LY_STMT_REFERENCE) {
                  pcVar5 = *local_58;
                  lVar8 = LY_STMT_REFERENCE;
                  ppcVar6 = local_58;
                }
                else {
                  if (lVar8 == LY_STMT_STATUS) {
                    LVar3 = parse_status(ctx,local_50,exts);
                    goto LAB_001718e5;
                  }
                  if (lVar8 != LY_STMT_DESCRIPTION) {
                    if (ctx == (lysp_yang_ctx *)0x0) {
                      plVar7 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar7 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar5 = lyplg_ext_stmt2str(lVar8);
                    format = "Invalid keyword \"%s\" as a child of \"%s\".";
                    goto LAB_00171a1b;
                  }
                  pcVar5 = *local_68;
                  lVar8 = LY_STMT_DESCRIPTION;
                  ppcVar6 = local_68;
                }
                exts_00 = (lysp_ext_instance **)0x2;
                LVar3 = parse_text_field(ctx,pcVar5,lVar8,(uint32_t)ppcVar6,(char **)0x2,
                                         Y_IDENTIF_ARG,(uint16_t *)exts,
                                         (lysp_ext_instance **)CONCAT44(kw,uStack_90));
              }
            }
LAB_001718e5:
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            LVar3 = get_keyword(ctx,&kw,&word,&word_len);
            lVar8 = kw;
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
            restrs = extraout_RDX_01;
            if (((!bVar9) && (*exts != (lysp_ext_instance *)0x0)) &&
               (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
               restrs = extraout_RDX_02, LVar3 != LY_SUCCESS)) {
              return LVar3;
            }
          } while( true );
        }
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_notif(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_notif **notifs)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_notif *notif;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), notifs, notif, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, notif->name, word, word_len, ret, cleanup);
    notif->nodetype = LYS_NOTIF;
    notif->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, notif->dsc, LY_STMT_DESCRIPTION, 0, &notif->dsc, Y_STR_ARG, NULL,
                    &notif->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &notif->iffeatures, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, notif->ref, LY_STMT_REFERENCE, 0, &notif->ref, Y_STR_ARG, NULL,
                    &notif->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &notif->flags, &notif->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "notification");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)notif, &notif->child));
            break;

        case LY_STMT_MUST:
            PARSER_CHECK_STMTVER2_RET(ctx, "must", "notification");
            LY_CHECK_RET(parse_restrs(ctx, kw, &notif->musts));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)notif, &notif->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)notif, &notif->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, notif, LY_STMT_NOTIFICATION, 0, &notif->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "notification");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, notif->exts, ret, cleanup);
    }

cleanup:
    return ret;
}